

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ShowExampleAppDockSpace(bool *p_open)

{
  bool bVar1;
  ImGuiID id;
  ImVec2 *pos;
  ImVec2 local_44;
  ImGuiID local_3c;
  ImGuiIO *pIStack_38;
  ImGuiID dockspace_id;
  ImGuiIO *io;
  ImVec2 local_28;
  ImGuiViewport *local_20;
  ImGuiViewport *viewport;
  bool *pbStack_10;
  ImGuiWindowFlags window_flags;
  bool *p_open_local;
  
  viewport._4_4_ = 0x200400;
  pbStack_10 = p_open;
  if (ShowExampleAppDockSpace::opt_fullscreen) {
    local_20 = ImGui::GetMainViewport();
    pos = &local_20->WorkPos;
    ImVec2::ImVec2(&local_28,0.0,0.0);
    ImGui::SetNextWindowPos(pos,0,&local_28);
    ImGui::SetNextWindowSize(&local_20->WorkSize,0);
    ImGui::SetNextWindowViewport(local_20->ID);
    ImGui::PushStyleVar(3,0.0);
    ImGui::PushStyleVar(4,0.0);
    viewport._4_4_ = viewport._4_4_ | 0x82027;
  }
  else {
    ShowExampleAppDockSpace::dockspace_flags = ShowExampleAppDockSpace::dockspace_flags & 0xfffffff7
    ;
  }
  if ((ShowExampleAppDockSpace::dockspace_flags & 8U) != 0) {
    viewport._4_4_ = viewport._4_4_ | 0x80;
  }
  if ((ShowExampleAppDockSpace::opt_padding & 1U) == 0) {
    ImVec2::ImVec2((ImVec2 *)&io,0.0,0.0);
    ImGui::PushStyleVar(2,(ImVec2 *)&io);
  }
  ImGui::Begin("DockSpace Demo",pbStack_10,viewport._4_4_);
  if ((ShowExampleAppDockSpace::opt_padding & 1U) == 0) {
    ImGui::PopStyleVar(1);
  }
  if ((ShowExampleAppDockSpace::opt_fullscreen & 1U) != 0) {
    ImGui::PopStyleVar(2);
  }
  pIStack_38 = ImGui::GetIO();
  if ((pIStack_38->ConfigFlags & 0x40U) == 0) {
    ShowDockingDisabledMessage();
  }
  else {
    id = ImGui::GetID("MyDockSpace");
    local_3c = id;
    ImVec2::ImVec2(&local_44,0.0,0.0);
    ImGui::DockSpace(id,&local_44,ShowExampleAppDockSpace::dockspace_flags,(ImGuiWindowClass *)0x0);
  }
  bVar1 = ImGui::BeginMenuBar();
  if (bVar1) {
    bVar1 = ImGui::BeginMenu("Options",true);
    if (bVar1) {
      ImGui::MenuItem("Fullscreen",(char *)0x0,&ShowExampleAppDockSpace::opt_fullscreen,true);
      ImGui::MenuItem("Padding",(char *)0x0,&ShowExampleAppDockSpace::opt_padding,true);
      ImGui::Separator();
      bVar1 = ImGui::MenuItem("Flag: NoSplit","",
                              (ShowExampleAppDockSpace::dockspace_flags & 0x10U) != 0,true);
      if (bVar1) {
        ShowExampleAppDockSpace::dockspace_flags = ShowExampleAppDockSpace::dockspace_flags ^ 0x10;
      }
      bVar1 = ImGui::MenuItem("Flag: NoResize","",
                              (ShowExampleAppDockSpace::dockspace_flags & 0x20U) != 0,true);
      if (bVar1) {
        ShowExampleAppDockSpace::dockspace_flags = ShowExampleAppDockSpace::dockspace_flags ^ 0x20;
      }
      bVar1 = ImGui::MenuItem("Flag: NoDockingInCentralNode","",
                              (ShowExampleAppDockSpace::dockspace_flags & 4U) != 0,true);
      if (bVar1) {
        ShowExampleAppDockSpace::dockspace_flags = ShowExampleAppDockSpace::dockspace_flags ^ 4;
      }
      bVar1 = ImGui::MenuItem("Flag: AutoHideTabBar","",
                              (ShowExampleAppDockSpace::dockspace_flags & 0x40U) != 0,true);
      if (bVar1) {
        ShowExampleAppDockSpace::dockspace_flags = ShowExampleAppDockSpace::dockspace_flags ^ 0x40;
      }
      bVar1 = ImGui::MenuItem("Flag: PassthruCentralNode","",
                              (ShowExampleAppDockSpace::dockspace_flags & 8U) != 0,
                              (bool)(ShowExampleAppDockSpace::opt_fullscreen & 1));
      if (bVar1) {
        ShowExampleAppDockSpace::dockspace_flags = ShowExampleAppDockSpace::dockspace_flags ^ 8;
      }
      ImGui::Separator();
      bVar1 = ImGui::MenuItem("Close",(char *)0x0,false,pbStack_10 != (_Bool *)0x0);
      if (bVar1) {
        *pbStack_10 = false;
      }
      ImGui::EndMenu();
    }
    HelpMarker(
              "When docking is enabled, you can ALWAYS dock MOST window into another! Try it now!\n- Drag from window title bar or their tab to dock/undock.\n- Drag from window menu button (upper-left button) to undock an entire node (all windows).\n- Hold SHIFT to disable docking (if io.ConfigDockingWithShift == false, default)\n- Hold SHIFT to enable docking (if io.ConfigDockingWithShift == true)\nThis demo app has nothing to do with enabling docking!\n\nThis demo app only demonstrate the use of ImGui::DockSpace() which allows you to manually create a docking node _within_ another window.\n\nRead comments in ShowExampleAppDockSpace() for more details."
              );
    ImGui::EndMenuBar();
  }
  ImGui::End();
  return;
}

Assistant:

void ShowExampleAppDockSpace(bool* p_open)
{
    // If you strip some features of, this demo is pretty much equivalent to calling DockSpaceOverViewport()!
    // In most cases you should be able to just call DockSpaceOverViewport() and ignore all the code below!
    // In this specific demo, we are not using DockSpaceOverViewport() because:
    // - we allow the host window to be floating/moveable instead of filling the viewport (when opt_fullscreen == false)
    // - we allow the host window to have padding (when opt_padding == true)
    // - we have a local menu bar in the host window (vs. you could use BeginMainMenuBar() + DockSpaceOverViewport() in your code!)
    // TL;DR; this demo is more complicated than what you would normally use.
    // If we removed all the options we are showcasing, this demo would become:
    //     void ShowExampleAppDockSpace()
    //     {
    //         ImGui::DockSpaceOverViewport(ImGui::GetMainViewport());
    //     }

    static bool opt_fullscreen = true;
    static bool opt_padding = false;
    static ImGuiDockNodeFlags dockspace_flags = ImGuiDockNodeFlags_None;

    // We are using the ImGuiWindowFlags_NoDocking flag to make the parent window not dockable into,
    // because it would be confusing to have two docking targets within each others.
    ImGuiWindowFlags window_flags = ImGuiWindowFlags_MenuBar | ImGuiWindowFlags_NoDocking;
    if (opt_fullscreen)
    {
        const ImGuiViewport* viewport = ImGui::GetMainViewport();
        ImGui::SetNextWindowPos(viewport->WorkPos);
        ImGui::SetNextWindowSize(viewport->WorkSize);
        ImGui::SetNextWindowViewport(viewport->ID);
        ImGui::PushStyleVar(ImGuiStyleVar_WindowRounding, 0.0f);
        ImGui::PushStyleVar(ImGuiStyleVar_WindowBorderSize, 0.0f);
        window_flags |= ImGuiWindowFlags_NoTitleBar | ImGuiWindowFlags_NoCollapse | ImGuiWindowFlags_NoResize | ImGuiWindowFlags_NoMove;
        window_flags |= ImGuiWindowFlags_NoBringToFrontOnFocus | ImGuiWindowFlags_NoNavFocus;
    }
    else
    {
        dockspace_flags &= ~ImGuiDockNodeFlags_PassthruCentralNode;
    }

    // When using ImGuiDockNodeFlags_PassthruCentralNode, DockSpace() will render our background
    // and handle the pass-thru hole, so we ask Begin() to not render a background.
    if (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode)
        window_flags |= ImGuiWindowFlags_NoBackground;

    // Important: note that we proceed even if Begin() returns false (aka window is collapsed).
    // This is because we want to keep our DockSpace() active. If a DockSpace() is inactive,
    // all active windows docked into it will lose their parent and become undocked.
    // We cannot preserve the docking relationship between an active window and an inactive docking, otherwise
    // any change of dockspace/settings would lead to windows being stuck in limbo and never being visible.
    if (!opt_padding)
        ImGui::PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0.0f, 0.0f));
    ImGui::Begin("DockSpace Demo", p_open, window_flags);
    if (!opt_padding)
        ImGui::PopStyleVar();

    if (opt_fullscreen)
        ImGui::PopStyleVar(2);

    // Submit the DockSpace
    ImGuiIO& io = ImGui::GetIO();
    if (io.ConfigFlags & ImGuiConfigFlags_DockingEnable)
    {
        ImGuiID dockspace_id = ImGui::GetID("MyDockSpace");
        ImGui::DockSpace(dockspace_id, ImVec2(0.0f, 0.0f), dockspace_flags);
    }
    else
    {
        ShowDockingDisabledMessage();
    }

    if (ImGui::BeginMenuBar())
    {
        if (ImGui::BeginMenu("Options"))
        {
            // Disabling fullscreen would allow the window to be moved to the front of other windows,
            // which we can't undo at the moment without finer window depth/z control.
            ImGui::MenuItem("Fullscreen", NULL, &opt_fullscreen);
            ImGui::MenuItem("Padding", NULL, &opt_padding);
            ImGui::Separator();

            if (ImGui::MenuItem("Flag: NoSplit",                "", (dockspace_flags & ImGuiDockNodeFlags_NoSplit) != 0))                 { dockspace_flags ^= ImGuiDockNodeFlags_NoSplit; }
            if (ImGui::MenuItem("Flag: NoResize",               "", (dockspace_flags & ImGuiDockNodeFlags_NoResize) != 0))                { dockspace_flags ^= ImGuiDockNodeFlags_NoResize; }
            if (ImGui::MenuItem("Flag: NoDockingInCentralNode", "", (dockspace_flags & ImGuiDockNodeFlags_NoDockingInCentralNode) != 0))  { dockspace_flags ^= ImGuiDockNodeFlags_NoDockingInCentralNode; }
            if (ImGui::MenuItem("Flag: AutoHideTabBar",         "", (dockspace_flags & ImGuiDockNodeFlags_AutoHideTabBar) != 0))          { dockspace_flags ^= ImGuiDockNodeFlags_AutoHideTabBar; }
            if (ImGui::MenuItem("Flag: PassthruCentralNode",    "", (dockspace_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0, opt_fullscreen)) { dockspace_flags ^= ImGuiDockNodeFlags_PassthruCentralNode; }
            ImGui::Separator();

            if (ImGui::MenuItem("Close", NULL, false, p_open != NULL))
                *p_open = false;
            ImGui::EndMenu();
        }
        HelpMarker(
            "When docking is enabled, you can ALWAYS dock MOST window into another! Try it now!" "\n"
            "- Drag from window title bar or their tab to dock/undock." "\n"
            "- Drag from window menu button (upper-left button) to undock an entire node (all windows)." "\n"
            "- Hold SHIFT to disable docking (if io.ConfigDockingWithShift == false, default)" "\n"
            "- Hold SHIFT to enable docking (if io.ConfigDockingWithShift == true)" "\n"
            "This demo app has nothing to do with enabling docking!" "\n\n"
            "This demo app only demonstrate the use of ImGui::DockSpace() which allows you to manually create a docking node _within_ another window." "\n\n"
            "Read comments in ShowExampleAppDockSpace() for more details.");

        ImGui::EndMenuBar();
    }

    ImGui::End();
}